

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

ExprTree * __thiscall
PcodeCompile::createUserOp
          (PcodeCompile *this,UserOpSymbol *sym,
          vector<ExprTree_*,_std::allocator<ExprTree_*>_> *param)

{
  VarnodeTpl *vt;
  ExprTree *this_00;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvVar1;
  reference ppOVar2;
  VarnodeTpl *this_01;
  ExprTree *res;
  VarnodeTpl *outvn;
  vector<ExprTree_*,_std::allocator<ExprTree_*>_> *param_local;
  UserOpSymbol *sym_local;
  PcodeCompile *this_local;
  
  vt = buildTemporary(this);
  this_00 = (ExprTree *)operator_new(0x10);
  ExprTree::ExprTree(this_00);
  pvVar1 = createUserOpNoOut(this,sym,param);
  this_00->ops = pvVar1;
  ppOVar2 = std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::back(this_00->ops);
  OpTpl::setOutput(*ppOVar2,vt);
  this_01 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(this_01,vt);
  this_00->outvn = this_01;
  return this_00;
}

Assistant:

ExprTree *PcodeCompile::createUserOp(UserOpSymbol *sym,vector<ExprTree *> *param)

{ // Create userdefined pcode op, given symbol and parameters
  VarnodeTpl *outvn = buildTemporary();
  ExprTree *res = new ExprTree();
  res->ops = createUserOpNoOut(sym,param);
  res->ops->back()->setOutput(outvn);
  res->outvn = new VarnodeTpl(*outvn);
  return res;
}